

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  undefined8 uVar4;
  runtime_error *this;
  long *plVar5;
  size_type *psVar6;
  bool bVar7;
  pointer pbVar8;
  text val;
  text opt;
  text arg;
  texts in;
  text local_248;
  int local_224;
  undefined1 local_220 [32];
  _Alloc_hider local_200;
  pointer pbStack_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  ulong local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 local_170;
  seed_t local_168;
  undefined8 local_160;
  text local_158;
  text local_138;
  undefined1 local_118 [32];
  pointer local_f8;
  pointer pbStack_f0;
  value_type local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a8;
  text local_a0;
  text local_80;
  runtime_error local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar8 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_224 = 1;
    local_220[5] = 0;
    local_220[6] = 0;
    local_220[7] = 0;
    local_220[8] = 0;
    local_220[9] = 0;
    local_220[10] = 0;
    local_220[0xb] = 0;
    local_220._16_8_ = 0;
    local_220[4] = 0;
    local_220[3] = 0;
    local_220[2] = 0;
    local_220[1] = 0;
    local_220[0] = 0;
  }
  else {
    local_224 = 1;
    bVar7 = true;
    local_1a0 = 0;
    local_1a8 = 0;
    local_1b0 = 0;
    local_1c0 = 0;
    local_1b8 = 0;
    local_168 = 0;
    local_160 = 0;
    local_1f0.field_2._M_allocated_capacity = 0;
    local_178 = 0;
    local_170 = 0;
    local_1f0.field_2._8_8_ = 0;
    local_1d0 = 0;
    local_1c8 = 0;
    local_a8 = __return_storage_ptr__;
    do {
      local_118._0_8_ = local_118 + 0x10;
      local_118._8_8_ = 0;
      local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
      local_198 = local_188;
      local_190 = 0;
      local_188[0] = 0;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      pcVar2 = (pbVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar2,pcVar2 + pbVar8->_M_string_length);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,local_e8._M_dataplus._M_p,
                 local_e8._M_dataplus._M_p + local_e8._M_string_length);
      split_option((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_220,&local_248);
      std::__cxx11::string::operator=((string *)local_118,(string *)local_220);
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_200);
      if ((pointer)local_200._M_p != &local_1f0) {
        operator_delete(local_200._M_p);
      }
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if (bVar7) {
        if (*(char *)local_118._0_8_ != '-') {
          bVar7 = false;
          goto LAB_0010ebf9;
        }
        iVar3 = std::__cxx11::string::compare(local_118);
        if (iVar3 == 0) {
          bVar7 = false;
        }
        else {
          uVar4 = std::__cxx11::string::compare(local_118);
          if (((int)uVar4 == 0) ||
             (uVar4 = std::__cxx11::string::compare(local_118), (int)uVar4 == 0)) {
            local_1a0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
          }
          else {
            uVar4 = std::__cxx11::string::compare(local_118);
            if (((int)uVar4 == 0) ||
               (uVar4 = std::__cxx11::string::compare(local_118), (int)uVar4 == 0)) {
              local_1a8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            }
            else {
              uVar4 = std::__cxx11::string::compare(local_118);
              if (((int)uVar4 == 0) ||
                 (uVar4 = std::__cxx11::string::compare(local_118), (int)uVar4 == 0)) {
                local_1b0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
              }
              else {
                uVar4 = std::__cxx11::string::compare(local_118);
                if (((int)uVar4 == 0) ||
                   (uVar4 = std::__cxx11::string::compare(local_118), (int)uVar4 == 0)) {
                  local_1b8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                }
                else {
                  uVar4 = std::__cxx11::string::compare(local_118);
                  if (((int)uVar4 == 0) ||
                     (uVar4 = std::__cxx11::string::compare(local_118), (int)uVar4 == 0)) {
                    local_1c0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                  }
                  else {
                    uVar4 = std::__cxx11::string::compare(local_118);
                    if (((int)uVar4 == 0) ||
                       (uVar4 = std::__cxx11::string::compare(local_118), (int)uVar4 == 0)) {
                      local_1c8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                    }
                    else {
                      uVar4 = std::__cxx11::string::compare(local_118);
                      if (((int)uVar4 == 0) ||
                         (uVar4 = std::__cxx11::string::compare(local_118), (int)uVar4 == 0)) {
                        local_1d0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                      }
                      else {
                        uVar4 = std::__cxx11::string::compare(local_118);
                        if (((int)uVar4 == 0) ||
                           (uVar4 = std::__cxx11::string::compare(local_118), (int)uVar4 == 0)) {
                          local_1f0.field_2._8_8_ = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                        }
                        else {
                          uVar4 = std::__cxx11::string::compare(local_118);
                          if (((int)uVar4 == 0) ||
                             (uVar4 = std::__cxx11::string::compare(local_118), (int)uVar4 == 0)) {
                            local_1f0.field_2._M_allocated_capacity =
                                 CONCAT71((int7)((ulong)uVar4 >> 8),1);
                          }
                          else {
                            uVar4 = std::__cxx11::string::compare(local_118);
                            if ((int)uVar4 == 0) {
                              local_160 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare(local_118);
                              if ((iVar3 != 0) ||
                                 (iVar3 = std::__cxx11::string::compare((char *)&local_198),
                                 iVar3 != 0)) {
                                iVar3 = std::__cxx11::string::compare(local_118);
                                if ((iVar3 == 0) &&
                                   (uVar4 = std::__cxx11::string::compare((char *)&local_198),
                                   (int)uVar4 == 0)) {
                                  local_170 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare(local_118);
                                  if ((iVar3 == 0) &&
                                     (uVar4 = std::__cxx11::string::compare((char *)&local_198),
                                     (int)uVar4 == 0)) {
                                    local_178 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare(local_118);
                                    if (iVar3 == 0) {
                                      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                *)(local_220 + 0x10);
                                      local_220._0_8_ = paVar1;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_220,"--random-seed","");
                                      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_220._0_8_ == paVar1) {
                                        local_138.field_2._8_4_ = local_220._24_4_;
                                        local_138.field_2._12_4_ = local_220._28_4_;
                                      }
                                      else {
                                        local_138._M_dataplus._M_p = (pointer)local_220._0_8_;
                                      }
                                      local_138.field_2._M_allocated_capacity = local_220._16_8_;
                                      local_138._M_string_length = local_220._8_8_;
                                      local_220._8_8_ = 0;
                                      local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
                                      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
                                      local_220._0_8_ = paVar1;
                                      std::__cxx11::string::_M_construct<char*>
                                                ((string *)&local_80,local_198,local_198 + local_190
                                                );
                                      local_168 = seed(&local_138,&local_80);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_80._M_dataplus._M_p != &local_80.field_2) {
                                        operator_delete(local_80._M_dataplus._M_p);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                        operator_delete(local_138._M_dataplus._M_p);
                                      }
                                      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
                                        operator_delete((void *)local_220._0_8_);
                                      }
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare(local_118);
                                      if (iVar3 != 0) {
                                        this = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::operator+(&local_50,"unrecognised option \'",
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_118);
                                        plVar5 = (long *)std::__cxx11::string::append
                                                                   ((char *)&local_50);
                                        local_220._0_8_ = *plVar5;
                                        psVar6 = (size_type *)(plVar5 + 2);
                                        if ((size_type *)local_220._0_8_ == psVar6) {
                                          local_220._16_8_ = *psVar6;
                                          local_220._24_8_ = plVar5[3];
                                          local_220._0_8_ = local_220 + 0x10;
                                        }
                                        else {
                                          local_220._16_8_ = *psVar6;
                                        }
                                        local_220._8_8_ = plVar5[1];
                                        *plVar5 = (long)psVar6;
                                        plVar5[1] = 0;
                                        *(undefined1 *)(plVar5 + 2) = 0;
                                        std::runtime_error::runtime_error
                                                  (local_60,(string *)local_220);
                                        std::runtime_error::runtime_error(this,local_60);
                                        __cxa_throw(this,&std::runtime_error::typeinfo,
                                                    std::runtime_error::~runtime_error);
                                      }
                                      local_220._0_8_ = local_220 + 0x10;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_220,"--repeat","");
                                      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_220._0_8_ ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)(local_220 + 0x10)) {
                                        local_158.field_2._8_4_ = local_220._24_4_;
                                        local_158.field_2._12_4_ = local_220._28_4_;
                                      }
                                      else {
                                        local_158._M_dataplus._M_p = (pointer)local_220._0_8_;
                                      }
                                      local_158.field_2._M_allocated_capacity = local_220._16_8_;
                                      local_158._M_string_length = local_220._8_8_;
                                      local_220._8_8_ = 0;
                                      local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
                                      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                                      local_220._0_8_ =
                                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                            *)(local_220 + 0x10);
                                      std::__cxx11::string::_M_construct<char*>
                                                ((string *)&local_a0,local_198,local_198 + local_190
                                                );
                                      local_224 = repeat(&local_158,&local_a0);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                                        operator_delete(local_a0._M_dataplus._M_p);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_158._M_dataplus._M_p != &local_158.field_2) {
                                        operator_delete(local_158._M_dataplus._M_p);
                                      }
                                      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
                                        operator_delete((void *)local_220._0_8_);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
LAB_0010ebf9:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_c8,&local_e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_198 != local_188) {
        operator_delete(local_198);
      }
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    local_220[7] = (undefined1)local_1f0.field_2._8_8_;
    local_220[6] = 1;
    if ((local_1d0 & 1) == 0) {
      local_220[6] = local_220[7];
    }
    local_220[0xb] = (undefined1)local_160;
    local_220[9] = (undefined1)local_178;
    local_220[8] = (undefined1)local_170;
    local_220[5] = (undefined1)local_1c8;
    local_220[10] = (undefined1)local_1f0.field_2._M_allocated_capacity;
    local_220[4] = (undefined1)local_1b8;
    local_220[3] = (undefined1)local_1c0;
    local_220[2] = (undefined1)local_1b0;
    local_220[1] = (undefined1)local_1a8;
    local_220[0] = (undefined1)local_1a0;
    local_220._16_8_ = local_168;
    __return_storage_ptr__ = local_a8;
  }
  local_220._12_4_ = local_224;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_220 + 0x18),&local_c8);
  local_118._0_8_ = local_220._0_8_;
  local_118._8_8_ = local_220._8_8_;
  local_118._16_8_ = local_220._16_8_;
  local_118._24_8_ = local_220._24_8_;
  local_f8 = (pointer)local_200._M_p;
  pbStack_f0 = pbStack_1f8;
  pbStack_1f8 = (pointer)0x0;
  local_220._24_8_ = 0;
  local_200._M_p = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_220 + 0x18));
  (__return_storage_ptr__->first).seed = local_118._16_8_;
  (__return_storage_ptr__->first).help = (bool)local_118[0];
  (__return_storage_ptr__->first).abort = (bool)local_118[1];
  (__return_storage_ptr__->first).count = (bool)local_118[2];
  (__return_storage_ptr__->first).list = (bool)local_118[3];
  (__return_storage_ptr__->first).tags = (bool)local_118[4];
  (__return_storage_ptr__->first).time = (bool)local_118[5];
  (__return_storage_ptr__->first).pass = (bool)local_118[6];
  (__return_storage_ptr__->first).zen = (bool)local_118[7];
  (__return_storage_ptr__->first).lexical = (bool)local_118[8];
  (__return_storage_ptr__->first).random = (bool)local_118[9];
  (__return_storage_ptr__->first).verbose = (bool)local_118[10];
  (__return_storage_ptr__->first).version = (bool)local_118[0xb];
  (__return_storage_ptr__->first).repeat = local_118._12_4_;
  (__return_storage_ptr__->second).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_118._24_8_;
  (__return_storage_ptr__->second).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_f8;
  (__return_storage_ptr__->second).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbStack_f0;
  pbStack_f0 = (pointer)0x0;
  local_118._24_8_ = 0;
  local_f8 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_118 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}